

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apu.cpp
# Opt level: O2

void __thiscall
trackerboy::apu::Hardware::
runAndMixChannel<trackerboy::apu::WaveChannel,(trackerboy::apu::MixMode)2>
          (Hardware *this,size_t index,WaveChannel *ch,Mixer *mixer,uint32_t cycletime,
          uint32_t cycles)

{
  uint32_t uVar1;
  uint32_t uVar2;
  bool bVar3;
  anon_class_32_4_a2a720fc mixChanges;
  uint32_t local_44;
  anon_class_32_4_a2a720fc local_40;
  
  local_40.cycletime = &local_44;
  local_40.last = (this->mLastOutputs)._M_elems + index;
  local_44 = cycletime;
  local_40.ch = ch;
  local_40.mixer = mixer;
  runAndMixChannel<trackerboy::apu::WaveChannel,_(trackerboy::apu::MixMode)2>::
  anon_class_32_4_a2a720fc::operator()(&local_40);
  local_44 = local_44 + (ch->super_Channel).mTimer.mCounter;
  uVar2 = Timer::fastforward(&(ch->super_Channel).mTimer,cycles);
  uVar1 = (ch->super_Channel).mTimer.mPeriod;
  while (bVar3 = uVar2 != 0, uVar2 = uVar2 - 1, bVar3) {
    WaveChannel::clock(ch);
    runAndMixChannel<trackerboy::apu::WaveChannel,_(trackerboy::apu::MixMode)2>::
    anon_class_32_4_a2a720fc::operator()(&local_40);
    local_44 = local_44 + uVar1;
  }
  return;
}

Assistant:

void Hardware::runAndMixChannel(size_t index, Channel &ch, Mixer &mixer, uint32_t cycletime, uint32_t cycles) noexcept {
    static_assert(mode != MixMode::mute, "cannot mix a muted mode");

    auto &last = mLastOutputs[index];

    auto mixChanges = [&]() {
        // mix any change in output
        if (auto out = ch.output(); out != last) {
            mixer.mixfast<mode>(out - last, cycletime);
            last = out;
        }
    };


    auto &timer = ch.timer();

    mixChanges();
    cycletime += timer.counter();

    // determine the number of clocks we are stepping
    auto clocks = timer.fastforward(cycles);
    auto const period = timer.period();

    // iterate each clock and mix any change in output
    while (clocks) {
        ch.clock();
        --clocks;
        mixChanges();
        cycletime += period;
    }

}